

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

void __thiscall Timidity::GF1Envelope::Release(GF1Envelope *this,Voice *v)

{
  ushort uVar1;
  
  uVar1 = v->sample->modes;
  if ((uVar1 & 0xc0) == 0x40) {
    if ((uVar1 & 0x20) != 0) {
      if ((this->super_MinEnvelope).stage < 3) {
        (this->super_MinEnvelope).stage = '\x03';
      }
      Recompute(this,v);
    }
  }
  else {
    (this->super_MinEnvelope).stage = '\x06';
    this->target = 0;
    this->increment = -this->rate[5];
  }
  (this->super_MinEnvelope).bUpdating = '\x01';
  return;
}

Assistant:

void GF1Envelope::Release(Voice *v)
{
	if (!(v->sample->modes & PATCH_NO_SRELEASE) || (v->sample->modes & PATCH_FAST_REL))
	{
		/* ramp out to minimum volume with rate from final release stage */
		stage = GF1_RELEASEC+1;
		target = 0;
		increment = -rate[GF1_RELEASEC];
	}
	else if (v->sample->modes & PATCH_SUSTAIN)
	{
		if (stage < GF1_RELEASE)
		{
			stage = GF1_RELEASE;
		}
		Recompute(v);
	}
	bUpdating = true;
}